

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVirtualProtocol.h
# Opt level: O0

uint32_t __thiscall
duckdb_apache::thrift::protocol::
TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
::readBool_virt(TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
                *this,reference value)

{
  reference value_00;
  uint32_t uVar1;
  TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
  *in_RDX;
  _Bit_type in_RSI;
  _Bit_type *in_RDI;
  
  value_00._M_mask = in_RSI;
  value_00._M_p = in_RDI;
  uVar1 = readBool(in_RDX,value_00);
  return uVar1;
}

Assistant:

uint32_t readBool_virt(duckdb::vector<bool>::reference value) override {
    return static_cast<Protocol_*>(this)->readBool(value);
  }